

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

int plot::detail::utf8_seq_length(uint8_t first)

{
  undefined4 local_c;
  uint8_t first_local;
  
  if ((first & 0x80) == 0) {
    local_c = 1;
  }
  else if ((first & 0xe0) == 0xc0) {
    local_c = 2;
  }
  else if ((first & 0xf0) == 0xe0) {
    local_c = 3;
  }
  else if ((first & 0xf8) == 0xf0) {
    local_c = 4;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

inline int utf8_seq_length(std::uint8_t first) {
        if ((first & ~utf8_start_masks[1]) == utf8_start_markers[1])
            return 1;
        else if ((first & ~utf8_start_masks[2]) == utf8_start_markers[2])
            return 2;
        else if ((first & ~utf8_start_masks[3]) == utf8_start_markers[3])
            return 3;
        else if ((first & ~utf8_start_masks[4]) == utf8_start_markers[4])
            return 4;
        else
            return 0;
    }